

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

void __thiscall ImGuiTextBuffer::clear(ImGuiTextBuffer *this)

{
  int *piVar1;
  char *pcVar2;
  
  pcVar2 = (this->Buf).Data;
  if (pcVar2 != (char *)0x0) {
    (this->Buf).Size = 0;
    (this->Buf).Capacity = 0;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pcVar2,GImAllocatorUserData);
    (this->Buf).Data = (char *)0x0;
  }
  return;
}

Assistant:

void                clear()                 { Buf.clear(); }